

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O2

bool ApprovalTests::FileNameSanitizerFactory::isForbidden(char c)

{
  long lVar1;
  int iVar2;
  allocator local_9;
  
  if (isForbidden(char)::forbiddenChars_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    if (iVar2 != 0) {
      ::std::__cxx11::string::string
                ((string *)&isForbidden(char)::forbiddenChars_abi_cxx11_,"\\/:?\"<>|\' ",&local_9);
      __cxa_atexit(::std::__cxx11::string::~string,&isForbidden(char)::forbiddenChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    }
  }
  lVar1 = ::std::__cxx11::string::find('\x10',(ulong)(uint)(int)c);
  return lVar1 != -1;
}

Assistant:

bool FileNameSanitizerFactory::isForbidden(char c)
    {
        static std::string forbiddenChars("\\/:?\"<>|' ");
        return std::string::npos != forbiddenChars.find(c);
    }